

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void int_rel(IntVar *x,IntRelType t,IntVar *y,int c)

{
  undefined8 extraout_RAX;
  uint uVar1;
  longdouble lb;
  longdouble ub;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> x_00;
  IntView<0> x_01;
  vec<IntVar_*> vars;
  vec<int> coeffs;
  int local_6c;
  IntVar *local_68;
  IntVar *local_60;
  vec<IntVar_*> local_58;
  vec<int> local_48;
  ulong uVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  
  local_68 = y;
  local_60 = x;
  if (IRT_GT < t) {
    int_rel();
    goto switchD_001b370b_default;
  }
  uVar2 = (ulong)(uint)c;
  pIVar3 = y;
  pIVar4 = x;
  switch(t) {
  case IRT_EQ:
    int_rel(x,IRT_LE,y,c);
    int_rel(local_60,IRT_GE,local_68,c);
    goto LAB_001b3698;
  case IRT_NE:
    y_00._8_8_ = (uVar2 << 0x20) + 1;
    y_00.var = y;
    x_00.a = 1;
    x_00.b = 0;
    x_00.var = x;
    newBinNE(x_00,y_00,&bv_true);
    goto LAB_001b3698;
  case IRT_LE:
    uVar1 = -c;
    goto LAB_001b363f;
  case IRT_LT:
    uVar1 = 1 - c;
LAB_001b363f:
    uVar2 = (ulong)uVar1;
    pIVar3 = x;
    pIVar4 = y;
    break;
  case IRT_GE:
    break;
  case IRT_GT:
    uVar2 = (ulong)(c + 1);
  }
  y_01._8_8_ = (uVar2 << 0x20) + 1;
  y_01.var = pIVar3;
  x_01.a = 1;
  x_01.b = 0;
  x_01.var = pIVar4;
  newBinGE(x_01,y_01,&bv_true);
LAB_001b3698:
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (int *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (IntVar **)0x0;
  local_6c = 1;
  vec<int>::push(&local_48,&local_6c);
  local_6c = -1;
  vec<int>::push(&local_48,&local_6c);
  vec<IntVar_*>::push(&local_58,&local_60);
  vec<IntVar_*>::push(&local_58,&local_68);
  switch(t) {
  case IRT_EQ:
  case IRT_NE:
    goto switchD_001b370b_caseD_0;
  case IRT_LE:
    lb = (longdouble)-1e+100;
    ub = (longdouble)c;
    break;
  case IRT_LT:
    lb = (longdouble)-1e+100;
    ub = (longdouble)(c + -1);
    break;
  case IRT_GE:
    goto LAB_001b374f;
  case IRT_GT:
    c = c + 1;
LAB_001b374f:
    ub = (longdouble)1e+100;
    lb = (longdouble)c;
    break;
  default:
switchD_001b370b_default:
    int_rel();
    if (local_58.data != (IntVar **)0x0) {
      free(local_58.data);
    }
    if (local_48.data != (int *)0x0) {
      free(local_48.data);
    }
    _Unwind_Resume(extraout_RAX);
  }
  MIP::addConstraint(mip,&local_48,&local_58,lb,ub);
switchD_001b370b_caseD_0:
  if (local_58.data != (IntVar **)0x0) {
    free(local_58.data);
  }
  if (local_48.data != (int *)0x0) {
    free(local_48.data);
  }
  return;
}

Assistant:

void int_rel(IntVar* x, IntRelType t, IntVar* y, int c) {
	switch (t) {
		case IRT_EQ:
			int_rel(x, IRT_LE, y, c);
			int_rel(x, IRT_GE, y, c);
			break;
		case IRT_NE:
			newBinNE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_LE:
			// a <= b <=> b >= a
			newBinGE(IntView<>(y), IntView<>(x, 1, -c));
			break;
		case IRT_LT:
			// a < b <=> b >= (a+1)
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c));
			break;
		case IRT_GE:
			// a >= b
			newBinGE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_GT:
			// a > b <=> a >= (b+1)
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c));
			break;
		default:
			NEVER;
	}

	vec<int> coeffs;
	vec<IntVar*> vars;

	coeffs.push(1);
	coeffs.push(-1);
	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
		case IRT_NE:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			mip->addConstraint(coeffs, vars, -1e100, c - 1);
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			mip->addConstraint(coeffs, vars, c + 1, 1e100);
			break;
		default:
			NEVER;
	}
}